

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

void resizestack(lua_State *L,MSize n)

{
  uint uVar1;
  uint uVar2;
  void *p;
  uint64_t uVar3;
  long lVar4;
  void *pvVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  
  p = (void *)(L->stack).ptr64;
  uVar2 = L->stacksize;
  uVar7 = (ulong)uVar2;
  uVar1 = n + 9;
  pvVar5 = lj_mem_realloc(L,p,(ulong)(uVar2 * 8),(ulong)(n * 8 + 0x48));
  (L->stack).ptr64 = (uint64_t)pvVar5;
  (L->maxstack).ptr64 = (uint64_t)((long)pvVar5 + (ulong)n * 8);
  if (uVar2 < uVar1) {
    memset((void *)((long)pvVar5 + uVar7 * 8),0xff,(ulong)((n - uVar2) + 8) * 8 + 8);
    uVar7 = (ulong)uVar1;
  }
  lVar8 = (long)pvVar5 - (long)p;
  L->stacksize = uVar1;
  uVar3 = (L->glref).ptr64;
  lVar4 = *(long *)(uVar3 + 0x178);
  if ((ulong)(lVar4 - (long)p) < uVar7) {
    *(long *)(uVar3 + 0x178) = lVar4 + lVar8;
  }
  L->base = (TValue *)((long)L->base + lVar8);
  L->top = (TValue *)((long)L->top + lVar8);
  for (puVar6 = (undefined8 *)(L->openupval).gcptr64; puVar6 != (undefined8 *)0x0;
      puVar6 = (undefined8 *)*puVar6) {
    puVar6[4] = puVar6[4] + lVar8;
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
}